

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brotli.c
# Opt level: O2

int NextFile(Context *context)

{
  char *__s;
  int iVar1;
  size_t sVar2;
  FILE *__stream;
  ulong uVar3;
  char *pcVar4;
  size_t sVar5;
  long lVar6;
  int *piVar7;
  int iVar8;
  char *pcVar9;
  
  iVar1 = context->iterator;
  context->iterator = iVar1 + 1;
  context->input_file_length = -1;
  if (context->input_count == 0) {
    if (0 < iVar1) {
      return 0;
    }
  }
  else {
    iVar8 = context->ignore;
    piVar7 = context->not_input_indices + iVar8;
    lVar6 = (long)(iVar1 + 1);
    iVar1 = iVar1 + 2;
    while( true ) {
      iVar8 = iVar8 + 1;
      if ((int)lVar6 != *piVar7) break;
      context->iterator = iVar1;
      context->ignore = iVar8;
      piVar7 = piVar7 + 1;
      lVar6 = lVar6 + 1;
      iVar1 = iVar1 + 1;
    }
    if (context->argc <= (int)lVar6) {
      return 0;
    }
    pcVar9 = context->argv[lVar6];
    sVar2 = strlen(pcVar9);
    if ((sVar2 != 1) || (*pcVar9 != '-')) {
      context->current_input_path = pcVar9;
      __stream = fopen(pcVar9,"rb");
      uVar3 = 0xffffffffffffffff;
      if (__stream != (FILE *)0x0) {
        iVar1 = fseek(__stream,0,2);
        if (iVar1 == 0) {
          uVar3 = ftell(__stream);
          iVar1 = fclose(__stream);
          uVar3 = -(ulong)(iVar1 != 0) | uVar3;
        }
        else {
          fclose(__stream);
        }
      }
      context->input_file_length = uVar3;
      context->current_output_path = context->output_path;
      if (context->output_path != (char *)0x0) {
        return 1;
      }
      if (context->write_to_stdout != 0) {
        return 1;
      }
      strcpy(context->modified_path,pcVar9);
      pcVar4 = context->modified_path;
      context->current_output_path = pcVar4;
      if (context->decompress == 0) {
        strcpy(pcVar4 + sVar2,context->suffix);
        return 1;
      }
      __s = context->suffix;
      sVar2 = strlen(__s);
      pcVar4 = FileName(pcVar4);
      sVar5 = strlen(pcVar4);
      if (sVar5 < sVar2 + 1) {
        pcVar4 = "con";
        if (pcVar9 != (char *)0x0) {
          pcVar4 = pcVar9;
        }
        pcVar9 = "empty output file name for [%s] input file\n";
      }
      else {
        iVar1 = strcmp(__s,pcVar4 + (sVar5 - sVar2));
        if (iVar1 == 0) {
          pcVar4[sVar5 - sVar2] = '\0';
          return 1;
        }
        pcVar4 = "con";
        if (pcVar9 != (char *)0x0) {
          pcVar4 = pcVar9;
        }
        pcVar9 = "input file [%s] suffix mismatch\n";
      }
      fprintf(_stderr,pcVar9,pcVar4);
      context->iterator_error = 1;
      return 0;
    }
  }
  context->current_input_path = (char *)0x0;
  context->current_output_path = context->output_path;
  return 1;
}

Assistant:

static BROTLI_BOOL NextFile(Context* context) {
  const char* arg;
  size_t arg_len;

  /* Iterator points to last used arg; increment to search for the next one. */
  context->iterator++;

  context->input_file_length = -1;

  /* No input path; read from console. */
  if (context->input_count == 0) {
    if (context->iterator > 1) return BROTLI_FALSE;
    context->current_input_path = NULL;
    /* Either write to the specified path, or to console. */
    context->current_output_path = context->output_path;
    return BROTLI_TRUE;
  }

  /* Skip option arguments. */
  while (context->iterator == context->not_input_indices[context->ignore]) {
    context->iterator++;
    context->ignore++;
  }

  /* All args are scanned already. */
  if (context->iterator >= context->argc) return BROTLI_FALSE;

  /* Iterator now points to the input file name. */
  arg = context->argv[context->iterator];
  arg_len = strlen(arg);
  /* Read from console. */
  if (arg_len == 1 && arg[0] == '-') {
    context->current_input_path = NULL;
    context->current_output_path = context->output_path;
    return BROTLI_TRUE;
  }

  context->current_input_path = arg;
  context->input_file_length = FileSize(arg);
  context->current_output_path = context->output_path;

  if (context->output_path) return BROTLI_TRUE;
  if (context->write_to_stdout) return BROTLI_TRUE;

  strcpy(context->modified_path, arg);
  context->current_output_path = context->modified_path;
  /* If output is not specified, input path suffix should match. */
  if (context->decompress) {
    size_t suffix_len = strlen(context->suffix);
    char* name = (char*)FileName(context->modified_path);
    char* name_suffix;
    size_t name_len = strlen(name);
    if (name_len < suffix_len + 1) {
      fprintf(stderr, "empty output file name for [%s] input file\n",
              PrintablePath(arg));
      context->iterator_error = BROTLI_TRUE;
      return BROTLI_FALSE;
    }
    name_suffix = name + name_len - suffix_len;
    if (strcmp(context->suffix, name_suffix) != 0) {
      fprintf(stderr, "input file [%s] suffix mismatch\n",
              PrintablePath(arg));
      context->iterator_error = BROTLI_TRUE;
      return BROTLI_FALSE;
    }
    name_suffix[0] = 0;
    return BROTLI_TRUE;
  } else {
    strcpy(context->modified_path + arg_len, context->suffix);
    return BROTLI_TRUE;
  }
}